

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O0

char * __thiscall
Memory::
PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
::TryAllocFreePages<false>
          (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
           *this,uint pageCount,PageSegmentBase<Memory::VirtualAllocWrapper> **pageSegment)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  undefined4 *puVar5;
  DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *node;
  PageSegmentBase<Memory::VirtualAllocWrapper> *pPVar6;
  PageSegmentBase<Memory::VirtualAllocWrapper> *freeSegment;
  EditingIterator i;
  char *pages;
  PageSegmentBase<Memory::VirtualAllocWrapper> **pageSegment_local;
  uint pageCount_local;
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  *this_local;
  
  uVar3 = (*this->_vptr_PageAllocatorBase[3])();
  if ((uVar3 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x3e5,"(!HasMultiThreadAccess())","!HasMultiThreadAccess()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  i.super_Iterator.current = (NodeBase *)0x0;
  if (this->freePageCount < (ulong)pageCount) {
LAB_00990696:
    this_local = (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                  *)TryAllocFromZeroPages(this,pageCount,pageSegment);
  }
  else {
    DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::EditingIterator::
    EditingIterator((EditingIterator *)&freeSegment,&this->segments);
    while( true ) {
      if (i.super_Iterator.list ==
          (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                           ,0x66,"(current != nullptr)","current != nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      pPVar6 = freeSegment;
      node = DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>::Next
                       (&(i.super_Iterator.list)->
                         super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>)
      ;
      bVar2 = DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::IsHead
                        ((DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>
                          *)pPVar6,node);
      if (bVar2) {
        i.super_Iterator.list =
             (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)0x0;
        goto LAB_00990696;
      }
      i.super_Iterator.list =
           (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)
           DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>::Next
                     (&(i.super_Iterator.list)->
                       super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>);
      pPVar6 = DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::Iterator
               ::Data((Iterator *)&freeSegment);
      i.super_Iterator.current =
           (NodeBase *)
           PageSegmentBase<Memory::VirtualAllocWrapper>::AllocPages<false>(pPVar6,pageCount);
      if (i.super_Iterator.current != (NodeBase *)0x0) break;
      i.super_Iterator.current = (NodeBase *)0x0;
    }
    LogAllocPages(this,(ulong)pageCount);
    uVar4 = PageSegmentBase<Memory::VirtualAllocWrapper>::GetFreePageCount(pPVar6);
    if (uVar4 == 0) {
      DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::EditingIterator::
      MoveCurrentTo((EditingIterator *)&freeSegment,&this->fullSegments);
    }
    this->freePageCount = this->freePageCount - (ulong)pageCount;
    *pageSegment = pPVar6;
    if (this->freePageCount < this->debugMinFreePageCount) {
      this->debugMinFreePageCount = this->freePageCount;
    }
    FillAllocPages(this,i.super_Iterator.current,pageCount);
    this_local = (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                  *)i.super_Iterator.current;
  }
  return (char *)this_local;
}

Assistant:

char *
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::TryAllocFreePages(uint pageCount, TPageSegment ** pageSegment)
{
    Assert(!HasMultiThreadAccess());
    char* pages = nullptr;

    if (this->freePageCount >= pageCount)
    {
        FAULTINJECT_MEMORY_NOTHROW(this->debugName, pageCount*AutoSystemInfo::PageSize);
        typename DListBase<TPageSegment>::EditingIterator i(&this->segments);

        while (i.Next())
        {
            TPageSegment * freeSegment = &i.Data();

            pages = freeSegment->template AllocPages<notPageAligned>(pageCount);
            if (pages != nullptr)
            {
                LogAllocPages(pageCount);
                if (freeSegment->GetFreePageCount() == 0)
                {
                    i.MoveCurrentTo(&this->fullSegments);
                }

                this->freePageCount -= pageCount;
                *pageSegment = freeSegment;

#if DBG
                UpdateMinimum(this->debugMinFreePageCount, this->freePageCount);
#endif
                this->FillAllocPages(pages, pageCount);
                return pages;
            }
        }
    }

    pages = TryAllocFromZeroPages(pageCount, pageSegment);

    return pages;
}